

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase197::run(TestCase197 *this)

{
  anon_enum_32 *in_R9;
  siginfo_t *in_stack_fffffffffffffdf8;
  siginfo_t *this_00;
  undefined1 local_1f8 [16];
  WaitScope waitScope;
  pthread_t mainThread;
  Own<kj::Function<void_()>::Iface> local_1d0;
  Thread thread;
  EventLoop loop;
  siginfo_t info;
  UnixEventPort port;
  
  captureSignals();
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  mainThread = pthread_self();
  local_1d0.ptr = (Iface *)operator_new(0x10);
  (local_1d0.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0041d918;
  local_1d0.ptr[1]._vptr_Iface = (_func_int **)&mainThread;
  local_1d0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::Function<void()>::Impl<kj::(anonymous_namespace)::TestCase197::run()::$_0>>
        ::instance;
  Thread::Thread(&thread,(Function<void_()> *)&local_1d0);
  Own<kj::Function<void_()>::Iface>::dispose(&local_1d0);
  UnixEventPort::onSignal((UnixEventPort *)local_1f8,(int)&port);
  this_00 = &info;
  Promise<siginfo_t>::wait((Promise<siginfo_t> *)this_00,local_1f8);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_1f8);
  if (info.si_signo != 0x17 && _::Debug::minSeverity < 3) {
    in_R9 = (anon_enum_32 *)local_1f8;
    local_1f8._0_4_ = _SC_AIO_LISTIO_MAX;
    _::Debug::log<char_const(&)[41],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0xd3,ERROR,"\"failed: expected \" \"(23) == (info.si_signo)\", 23, info.si_signo",
               (char (*) [41])"failed: expected (23) == (info.si_signo)",in_R9,&this_00->si_signo);
    in_stack_fffffffffffffdf8 = this_00;
  }
  if ((info.si_code != -6) && (_::Debug::minSeverity < 3)) {
    local_1f8._0_4_ = SI_TKILL;
    _::Debug::log<char_const(&)[46],__0,int&>
              ((char *)0xd5,0x3290f7,0x329142,local_1f8,(char (*) [46])&info.si_code,in_R9,
               &in_stack_fffffffffffffdf8->si_signo);
  }
  Thread::~Thread(&thread);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  UnixEventPort::~UnixEventPort(&port);
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsAsync) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  // Arrange for a signal to be sent from another thread.
  pthread_t mainThread = pthread_self();
  Thread thread([&]() {
    delay();
    pthread_kill(mainThread, SIGURG);
  });

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
#if __linux__
  EXPECT_SI_CODE(SI_TKILL, info.si_code);
#endif
}